

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O0

void __thiscall CppCNN::CppCNN(CppCNN *this)

{
  __type _Var1;
  CppCNN *this_local;
  
  std::enable_shared_from_this<CppCNN>::enable_shared_from_this
            (&this->super_enable_shared_from_this<CppCNN>);
  std::vector<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>::vector
            (&this->__layers);
  CppMLNN::CppMLNN(&this->__fcnn);
  this->__input_size = 0;
  this->__output_size = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->__hidden_layers_size);
  this->__examples_num = 0;
  this->__learn_rate_init = 0.0003;
  this->__learn_rate = 0.0003;
  this->__learn_rate_decay = 0.95;
  this->__beta1 = 0.9;
  this->__beta2 = 0.999;
  _Var1 = std::pow<int,int>(10,-8);
  this->__epsilon_rmsprop = _Var1;
  this->__lambda = 0.0;
  this->__sgd_enabled = true;
  this->__momentum_enabled = true;
  this->__adam_enabled = false;
  this->__learn_rate_decay_enabled = false;
  this->__epoch_batch = 0;
  this->__epoch = 0;
  this->__epoch_max = -1;
  this->__loss = INFINITY;
  this->__minimum_loss = 0.0;
  this->__mini_batch_size = 0x100;
  return;
}

Assistant:

CppCNN::CppCNN() {
}